

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::EnumOneofFieldGenerator::GenerateInlineAccessorDefinitions
          (EnumOneofFieldGenerator *this,Printer *printer)

{
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,
             &(this->super_EnumFieldGenerator).super_FieldGenerator.variables_._M_t);
  Formatter::operator()<>
            (&local_48,
             "inline $type$ $classname$::_internal_$name$() const {\n  if (_internal_has_$name$()) {\n    return static_cast< $type$ >($field_member$);\n  }\n  return static_cast< $type$ >($default$);\n}\ninline $type$ $classname$::$name$() const {\n$annotate_accessor$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$();\n}\ninline void $classname$::_internal_set_$name$($type$ value) {\n"
            );
  if (*(int *)(*(long *)((this->super_EnumFieldGenerator).super_FieldGenerator.descriptor_ + 0x28) +
              0x3c) != 3) {
    Formatter::operator()<>(&local_48,"  assert($type$_IsValid(value));\n");
  }
  Formatter::operator()<>
            (&local_48,
             "  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n  }\n  $field_member$ = value;\n}\ninline void $classname$::set_$name$($type$ value) {\n$annotate_accessor$  // @@protoc_insertion_point(field_set:$full_name$)\n  _internal_set_$name$(value);\n}\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void EnumOneofFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline $type$ $classname$::_internal_$name$() const {\n"
      "  if (_internal_has_$name$()) {\n"
      "    return static_cast< $type$ >($field_member$);\n"
      "  }\n"
      "  return static_cast< $type$ >($default$);\n"
      "}\n"
      "inline $type$ $classname$::$name$() const {\n"
      "$annotate_accessor$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n"
      "inline void $classname$::_internal_set_$name$($type$ value) {\n");
  if (!HasPreservingUnknownEnumSemantics(descriptor_)) {
    format("  assert($type$_IsValid(value));\n");
  }
  format(
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "  }\n"
      "  $field_member$ = value;\n"
      "}\n"
      "inline void $classname$::set_$name$($type$ value) {\n"
      "$annotate_accessor$"
      "  // @@protoc_insertion_point(field_set:$full_name$)\n"
      "  _internal_set_$name$(value);\n"
      "}\n");
}